

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3_str_append(sqlite3_str *p,char *z,int N)

{
  int in_EDX;
  StrAccum *in_RSI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  
  if ((uint)(*(int *)(in_RDI + 0x18) + in_EDX) < *(uint *)(in_RDI + 0x10)) {
    if (in_EDX != 0) {
      *(int *)(in_RDI + 0x18) = in_EDX + *(int *)(in_RDI + 0x18);
      memcpy((void *)(*(long *)(in_RDI + 8) + (ulong)(uint)(*(int *)(in_RDI + 0x18) - in_EDX)),
             in_RSI,(long)in_EDX);
    }
  }
  else {
    enlargeAndAppend(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
  }
  return;
}

Assistant:

SQLITE_API void sqlite3_str_append(sqlite3_str *p, const char *z, int N){
  assert( z!=0 || N==0 );
  assert( p->zText!=0 || p->nChar==0 || p->accError );
  assert( N>=0 );
  assert( p->accError==0 || p->nAlloc==0 || p->mxAlloc==0 );
  if( p->nChar+N >= p->nAlloc ){
    enlargeAndAppend(p,z,N);
  }else if( N ){
    assert( p->zText );
    p->nChar += N;
    memcpy(&p->zText[p->nChar-N], z, N);
  }
}